

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O1

int pkey_dh_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  int iVar1;
  DH *dh;
  
  dh = DH_new();
  if ((dh == (DH *)0x0) || (iVar1 = EVP_PKEY_assign_DH(pkey,(DH *)dh), iVar1 == 0)) {
    DH_free(dh);
    return 0;
  }
  if (((EVP_PKEY *)ctx->pkey != (EVP_PKEY *)0x0) &&
     (iVar1 = EVP_PKEY_copy_parameters((EVP_PKEY *)pkey,(EVP_PKEY *)ctx->pkey), iVar1 == 0)) {
    return 0;
  }
  iVar1 = DH_generate_key(dh);
  return iVar1;
}

Assistant:

static int pkey_dh_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  DH *dh = DH_new();
  if (dh == NULL || !EVP_PKEY_assign_DH(pkey, dh)) {
    DH_free(dh);
    return 0;
  }

  if (ctx->pkey != NULL && !EVP_PKEY_copy_parameters(pkey, ctx->pkey)) {
    return 0;
  }

  return DH_generate_key(dh);
}